

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::GetAsyncCommandResponse_SetupDataSource::
~GetAsyncCommandResponse_SetupDataSource(GetAsyncCommandResponse_SetupDataSource *this)

{
  GetAsyncCommandResponse_SetupDataSource *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GetAsyncCommandResponse_SetupDataSource_009c3280;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  protozero::CopyablePtr<perfetto::protos::gen::DataSourceConfig>::~CopyablePtr(&this->config_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

GetAsyncCommandResponse_SetupDataSource::~GetAsyncCommandResponse_SetupDataSource() = default;